

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgzf.c
# Opt level: O0

ssize_t bgzf_write(BGZF *fp,void *data,size_t length)

{
  int iVar1;
  int local_44;
  int copy_length;
  uint8_t *buffer;
  ssize_t remaining;
  uint8_t *input;
  size_t length_local;
  void *data_local;
  BGZF *fp_local;
  
  if ((*(int *)fp << 1) >> 0x1e == 0) {
    fp_local = (BGZF *)hwrite(fp->fp,data,length);
  }
  else {
    buffer = (uint8_t *)length;
    remaining = (ssize_t)data;
    if ((*(int *)fp << 0xe) >> 0x1e == 0) {
      __assert_fail("fp->is_write",
                    "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/bgzf.c"
                    ,0x307,"ssize_t bgzf_write(BGZF *, const void *, size_t)");
    }
    do {
      if ((long)buffer < 1) {
        return length - (long)buffer;
      }
      local_44 = 0xff00 - fp->block_offset;
      if ((long)buffer < (long)local_44) {
        local_44 = (int)buffer;
      }
      memcpy((void *)((long)fp->uncompressed_block + (long)fp->block_offset),(void *)remaining,
             (long)local_44);
      fp->block_offset = local_44 + fp->block_offset;
      remaining = remaining + local_44;
      buffer = buffer + -(long)local_44;
    } while ((fp->block_offset != 0xff00) || (iVar1 = lazy_flush(fp), iVar1 == 0));
    fp_local = (BGZF *)0xffffffffffffffff;
  }
  return (ssize_t)fp_local;
}

Assistant:

ssize_t bgzf_write(BGZF *fp, const void *data, size_t length)
{
    if ( !fp->is_compressed )
        return hwrite(fp->fp, data, length);

    const uint8_t *input = (const uint8_t*)data;
    ssize_t remaining = length;
    assert(fp->is_write);
    while (remaining > 0) {
        uint8_t* buffer = (uint8_t*)fp->uncompressed_block;
        int copy_length = BGZF_BLOCK_SIZE - fp->block_offset;
        if (copy_length > remaining) copy_length = remaining;
        memcpy(buffer + fp->block_offset, input, copy_length);
        fp->block_offset += copy_length;
        input += copy_length;
        remaining -= copy_length;
        if (fp->block_offset == BGZF_BLOCK_SIZE) {
            if (lazy_flush(fp) != 0) return -1;
        }
    }
    return length - remaining;
}